

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::BlockedPumpFrom::tryRead
          (BlockedPumpFrom *this,void *readBuffer,size_t minBytes,size_t maxBytes)

{
  bool bVar1;
  PromiseNode *extraout_RDX;
  Exception *in_R8;
  Promise<unsigned_long> PVar2;
  void *local_a8;
  size_t local_a0;
  size_t local_98;
  Exception *local_90;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> local_88;
  undefined1 local_80 [32];
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> local_60;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> max;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> min;
  uint64_t pumpLeft;
  Fault local_38;
  Fault f;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *readBuffer_local;
  BlockedPumpFrom *this_local;
  
  f.exception = in_R8;
  maxBytes_local = maxBytes;
  minBytes_local = minBytes;
  readBuffer_local = readBuffer;
  this_local = this;
  bVar1 = Canceler::isEmpty((Canceler *)((long)readBuffer + 0x38));
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16]>
              (&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,499,FAILED,"canceler.isEmpty()","\"already pumping\"",
               (char (*) [16])"already pumping");
    _::Debug::Fault::fatal(&local_38);
  }
  min = *(long *)((long)readBuffer + 0x28) - *(long *)((long)readBuffer + 0x30);
  max = min<unsigned_long&,unsigned_long&>(&min,&maxBytes_local);
  local_60 = min<unsigned_long&,unsigned_long&>(&min,(unsigned_long *)&f);
  (**(code **)(**(long **)((long)readBuffer + 0x20) + 8))
            ((Type *)local_80,*(long **)((long)readBuffer + 0x20),minBytes_local,max,local_60);
  local_a0 = minBytes_local;
  local_98 = maxBytes_local;
  local_90 = f.exception;
  local_88 = max;
  local_a8 = readBuffer;
  Promise<unsigned_long>::
  then<kj::(anonymous_namespace)::AsyncPipe::BlockedPumpFrom::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,kj::_::PropagateException>
            ((Promise<unsigned_long> *)(local_80 + 0x10),(Type *)local_80,
             (PropagateException *)&local_a8);
  Canceler::wrap<unsigned_long>
            ((Canceler *)this,(Promise<unsigned_long> *)((long)readBuffer + 0x38));
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)(local_80 + 0x10));
  Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)local_80);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* readBuffer, size_t minBytes, size_t maxBytes) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");

      auto pumpLeft = amount - pumpedSoFar;
      auto min = kj::min(pumpLeft, minBytes);
      auto max = kj::min(pumpLeft, maxBytes);
      return canceler.wrap(input.tryRead(readBuffer, min, max)
          .then([this,readBuffer,minBytes,maxBytes,min](size_t actual) -> kj::Promise<size_t> {
        canceler.release();
        pumpedSoFar += actual;
        KJ_ASSERT(pumpedSoFar <= amount);

        if (pumpedSoFar == amount || actual < min) {
          // Either we pumped all we wanted or we hit EOF.
          fulfiller.fulfill(kj::cp(pumpedSoFar));
          pipe.endState(*this);
        }

        if (actual >= minBytes) {
          return actual;
        } else {
          return pipe.tryRead(reinterpret_cast<byte*>(readBuffer) + actual,
                              minBytes - actual, maxBytes - actual)
              .then([actual](size_t actual2) { return actual + actual2; });
        }
      }));
    }